

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

int AMPLSetOption<double>(AMPLS_MP_Solver *slv,char *name,double v)

{
  SolverOption *pSVar1;
  
  pSVar1 = mp::SolverOptionManager::GetOption
                     ((SolverOptionManager *)(*slv->internal_info_ + 0x28),name);
  (*pSVar1->_vptr_SolverOption[8])(v,pSVar1);
  return 0;
}

Assistant:

int AMPLSetOption(AMPLS_MP_Solver* slv,
  const char* name, T v) {
  auto be = AMPLSGetBackend(slv);
  try {
    auto opt = be->GetOption(name);
    opt->SetValue(v);
    return 0;
  }
  catch (const mp::OptionError& o) {
    ((AMPLS_MP__internal*)(slv->internal_info_))->msg_extra_.
      push_back(o.what());
    return 1;
  }
  catch (const std::runtime_error& e) {
    ((AMPLS_MP__internal*)(slv->internal_info_))->msg_extra_.
      push_back(e.what());
  }
  catch (const std::exception& ) {
  }
  return 2;
}